

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O2

void __thiscall TinyGC::DetachMainThread(TinyGC *this)

{
  mapped_type pTVar1;
  ostream *poVar2;
  pthread_t pVar3;
  mapped_type *ppTVar4;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lck;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Detach Main Thread");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_40,&this->ts_mxt_);
  if ((this->thread_to_stack_)._M_h._M_element_count == 1) {
    pVar3 = pthread_self();
    lck._8_8_ = pVar3;
    ppTVar4 = std::__detail::
              _Map_base<std::thread::id,_std::pair<const_std::thread::id,_TinyGC::ThreadState_*>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>,_std::__detail::_Select1st,_std::equal_to<std::thread::id>,_std::hash<std::thread::id>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<std::thread::id,_std::pair<const_std::thread::id,_TinyGC::ThreadState_*>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>,_std::__detail::_Select1st,_std::equal_to<std::thread::id>,_std::hash<std::thread::id>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->thread_to_stack_,(key_type *)&lck._M_owns);
    pTVar1 = *ppTVar4;
    lck._8_8_ = pVar3;
    std::
    _Hashtable<std::thread::id,_std::pair<const_std::thread::id,_TinyGC::ThreadState_*>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>,_std::__detail::_Select1st,_std::equal_to<std::thread::id>,_std::hash<std::thread::id>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->thread_to_stack_)._M_h);
    operator_delete(pTVar1,0x20);
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_40);
    MarkSweepGC(this);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    return;
  }
  __assert_fail("thread_to_stack_.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/v4kst1z[P]TinyGC/TinyGC.cpp"
                ,0x6f,"void TinyGC::DetachMainThread()");
}

Assistant:

void TinyGC::DetachMainThread() {
  LOG("Detach Main Thread");
  std::unique_lock<std::mutex> lck(ts_mxt_);
  assert(thread_to_stack_.size() == 1);
  ThreadState *ts = thread_to_stack_[std::this_thread::get_id()];
  thread_to_stack_.erase(std::this_thread::get_id());
  delete ts;
  lck.unlock();
  MarkSweepGC();
}